

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  void *pvVar8;
  int *piVar9;
  Layer *pLVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 uVar20;
  uint uVar21;
  _func_int *p_Var22;
  _func_int **pp_Var23;
  int iVar24;
  undefined4 *puVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  float fVar30;
  int iVar31;
  Option *_elemsize;
  undefined1 (*pauVar32) [16];
  uint uVar33;
  int iVar34;
  uint _elempack;
  Option *opt_00;
  long lVar35;
  size_t sVar36;
  int iVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  ushort uVar45;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  int iVar54;
  ushort uVar56;
  int iVar57;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ushort uVar55;
  ushort uVar58;
  undefined1 auVar49 [16];
  float fVar60;
  float fVar61;
  v4sf one;
  float fVar62;
  int iVar63;
  float fVar64;
  int iVar75;
  int iVar77;
  __m128 min;
  int iVar79;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  float fVar78;
  float fVar80;
  undefined1 auVar74 [16];
  float fVar81;
  float fVar82;
  char cVar93;
  char cVar94;
  char cVar96;
  float fVar97;
  float fVar98;
  char cVar99;
  char cVar100;
  float fVar101;
  float fVar102;
  __m128 max;
  char cVar95;
  undefined1 auVar83 [16];
  float fVar103;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar104;
  float fVar105;
  float fVar121;
  float fVar122;
  undefined1 auVar106 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar124;
  short sVar129;
  __m128 _a;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Option opt_g;
  float *local_2f0;
  undefined1 local_2e8 [52];
  int iStack_2b4;
  int iStack_2b0;
  undefined4 uStack_2ac;
  size_t local_2a8;
  float *local_298;
  pointer local_290;
  Mat local_288;
  ulong local_238;
  pointer local_230;
  Mat local_228;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  pointer local_1c8;
  int *local_1c0;
  Allocator *local_1b8;
  int local_1b0;
  Allocator *local_1a8;
  undefined4 local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  ulong local_188;
  void *local_180;
  int *local_178;
  ulong local_170;
  int local_168;
  Allocator *local_160;
  undefined4 local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  ulong local_140;
  size_type local_138;
  Mat local_130;
  undefined1 local_e8 [16];
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  short sVar59;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar125 [12];
  undefined1 auVar126 [16];
  
  local_130.c = bottom_blob->c;
  local_130.elempack = bottom_blob->elempack;
  local_130.elemsize = bottom_blob->elemsize;
  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var22 = pp_Var23[-3];
  iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var22);
  iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var22);
  iVar29 = *(int *)(&this->field_0xdc + (long)p_Var22);
  iVar40 = *(int *)(&this->field_0xe0 + (long)p_Var22);
  local_130.data = bottom_blob->data;
  local_130.refcount = bottom_blob->refcount;
  local_130.allocator = bottom_blob->allocator;
  local_130.dims = bottom_blob->dims;
  local_130.w = bottom_blob->w;
  local_130.h = bottom_blob->h;
  local_130.d = bottom_blob->d;
  local_130.cstep = bottom_blob->cstep;
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    *local_130.refcount = *local_130.refcount + 1;
    UNLOCK();
    pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
  }
  if (local_130.elempack == 0 || ((int)local_130.elemsize * 8) / local_130.elempack != 8) {
    uVar39 = (long)(local_130.elempack * local_130.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var23[-3]);
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize._0_4_ = 0;
    local_228.elemsize._4_4_ = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_130.elempack * local_130.c,4,(Allocator *)0x0);
    pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
    p_Var22 = pp_Var23[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var22)) {
      lVar35 = 0;
      puVar25 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar39) {
          uVar5 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var22) + lVar35 * 4);
          uVar41 = uVar39 & 0xffffffff;
          do {
            *puVar25 = uVar5;
            puVar25 = puVar25 + 1;
            uVar27 = (int)uVar41 - 1;
            uVar41 = (ulong)uVar27;
          } while (uVar27 != 0);
          p_Var22 = pp_Var23[-3];
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 < *(int *)(&this->field_0x108 + (long)p_Var22));
    }
    local_2e8._0_8_ = *(undefined8 *)opt;
    local_2e8._16_8_ = opt->workspace_allocator;
    local_2e8._24_4_ = opt->openmp_blocktime;
    local_2e8[0x1c] = opt->use_winograd_convolution;
    local_2e8[0x1d] = opt->use_sgemm_convolution;
    local_2e8[0x1e] = opt->use_int8_inference;
    local_2e8[0x1f] = opt->use_vulkan_compute;
    local_2e8._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    local_2e8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_2e8._48_4_ = opt->flush_denormals;
    unique0x00006c84 = opt->use_local_pool_allocator;
    unique0x00006c85 = opt->use_reserved_1;
    unique0x00006c86 = opt->use_reserved_2;
    unique0x00006c87 = opt->use_reserved_3;
    unique0x00006c88 = opt->use_reserved_4;
    unique0x00006c89 = opt->use_reserved_5;
    unique0x00006c8a = opt->use_reserved_6;
    unique0x00006c8b = opt->use_reserved_7;
    unique0x00006c8c = opt->use_reserved_8;
    unique0x00006c8d = opt->use_reserved_9;
    unique0x00006c8e = opt->use_reserved_10;
    unique0x00006c8f = opt->use_reserved_11;
    local_2e8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_130,&local_228,(Option *)local_2e8);
    piVar9 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
  }
  local_228.cstep = 0;
  local_228.data = (pointer)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize._0_4_ = 0;
  local_228.elemsize._4_4_ = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]),&local_130,
             &local_228,opt);
  iVar34 = local_228.w;
  iVar28 = local_228.elempack;
  iVar26 = -100;
  if (((pointer)local_228.data == (pointer)0x0) || (local_228.cstep * (long)local_228.c == 0))
  goto LAB_0027bab6;
  p_Var22 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar24 = (~((iVar24 + -1) * iVar29) + local_228.w) / *(int *)(&this->field_0xe4 + (long)p_Var22);
  iVar29 = iVar24 + 1;
  uVar39 = (long)(~((iVar37 + -1) * iVar40) + local_228.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var22);
  local_238 = uVar39 & 0xffffffff;
  iVar37 = (int)uVar39 + 1;
  uVar27 = local_228.elempack * local_228.c;
  if ((uVar27 == *(uint *)(&this->field_0x108 + (long)p_Var22)) &&
     (uVar27 - *(int *)(&this->field_0xd0 + (long)p_Var22) == 0)) {
    uVar33 = 8;
    if (opt->use_packing_layout == false) {
      uVar33 = 1;
    }
    if ((uVar27 & 7) != 0) {
      uVar33 = 1;
    }
    opt_00 = (Option *)(ulong)uVar33;
    iVar40 = *(int *)(&this->field_0x10c + (long)p_Var22);
    _elemsize = (Option *)(ulong)(uVar33 * 4);
    if (100 < iVar40) {
      _elemsize = opt_00;
    }
    local_230 = (pointer)(long)local_228.c;
    Mat::create(top_blob,iVar29,iVar37,(int)uVar27 / (int)uVar33,(size_t)_elemsize,uVar33,
                opt->blob_allocator);
    iVar26 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0027bab6;
    iVar26 = 0;
    if (iVar28 == 1) {
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var22 = pp_Var23[-3];
      iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var22);
      if (iVar37 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var22) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var22) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var22) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var22) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var22) < 2)))) {
          if (iVar40 < 0x65) {
            local_2e8._0_8_ = (pointer)0x0;
            local_2e8._8_8_ = (Allocator *)0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var22 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
              lVar35 = 0;
              do {
                fVar30 = 1.0 / (*(float *)(*(long *)(p_Var22 + 0x1f8) + lVar35 * 4) *
                               *(float *)(*(long *)(p_Var22 + 0x240) + lVar35 * 4));
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar30);
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_288);
                  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar30;
                  local_2e8._8_8_ = local_2e8._8_8_ + 4;
                }
                lVar35 = lVar35 + 1;
                p_Var22 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]);
              } while (lVar35 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s1_int8_dequant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var22 + 0x168),*(Mat **)(p_Var22 + 0x1b0),
                       &local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2e8._0_8_ = (pointer)0x0;
            local_2e8._8_8_ = (Allocator *)0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var22 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
              lVar35 = 0;
              do {
                fVar30 = *(float *)(*(long *)(p_Var22 + 0x1f8) + lVar35 * 4);
                fVar60 = 0.0;
                if (fVar30 != 0.0) {
                  fVar60 = 1.0 / (fVar30 * *(float *)(*(long *)(p_Var22 + 0x240) + lVar35 * 4));
                }
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar60);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(p_Var22 + 0x288) + lVar35 * 4));
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_288);
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar60;
                  local_2e8._8_8_ = local_2e8._8_8_ + 4;
                }
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_1c8);
                }
                else {
                  *(float *)local_2e8._8_8_ = local_1c8._0_4_;
                  local_2e8._8_8_ = local_2e8._8_8_ + 4;
                }
                lVar35 = lVar35 + 1;
                p_Var22 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                          (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
              } while (lVar35 < *(int *)(&this->field_0x108 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s1_int8_requant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var22 + 0x168),*(Mat **)(p_Var22 + 0x1b0),
                       &local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          iVar37 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var22) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var22) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var22))) goto LAB_0027b56f;
          if (iVar40 < 0x65) {
            local_2e8._0_8_ = (pointer)0x0;
            local_2e8._8_8_ = (Allocator *)0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var22 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
              lVar35 = 0;
              do {
                fVar30 = 1.0 / (*(float *)(*(long *)(p_Var22 + 0x1f8) + lVar35 * 4) *
                               *(float *)(*(long *)(p_Var22 + 0x240) + lVar35 * 4));
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar30);
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_288);
                  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar30;
                  local_2e8._8_8_ = local_2e8._8_8_ + 4;
                }
                lVar35 = lVar35 + 1;
                p_Var22 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]);
              } while (lVar35 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_d8,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s2_int8_dequant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var22 + 0x168),*(Mat **)(p_Var22 + 0x1b0),
                       &local_d8,opt_00);
          }
          else {
            local_2e8._0_8_ = (pointer)0x0;
            local_2e8._8_8_ = (Allocator *)0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var22 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var23[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
              lVar35 = 0;
              do {
                fVar30 = *(float *)(*(long *)(p_Var22 + 0x1f8) + lVar35 * 4);
                fVar60 = 0.0;
                if (fVar30 != 0.0) {
                  fVar60 = 1.0 / (fVar30 * *(float *)(*(long *)(p_Var22 + 0x240) + lVar35 * 4));
                }
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar60);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(p_Var22 + 0x288) + lVar35 * 4));
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_288);
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar60;
                  local_2e8._8_8_ = local_2e8._8_8_ + 4;
                }
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_1c8);
                }
                else {
                  *(float *)local_2e8._8_8_ = local_1c8._0_4_;
                  local_2e8._8_8_ = local_2e8._8_8_ + 4;
                }
                lVar35 = lVar35 + 1;
                p_Var22 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                          (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
              } while (lVar35 < *(int *)(&this->field_0x108 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_c0,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s2_int8_requant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var22 + 0x168),*(Mat **)(p_Var22 + 0x1b0),
                       &local_c0,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
        }
        pLVar10 = this->activation;
        if (pLVar10 != (Layer *)0x0) {
          (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
          iVar26 = 0;
          goto LAB_0027bab6;
        }
      }
      else {
LAB_0027b56f:
        uVar27 = iVar37 * *(int *)(&this->field_0xd4 + (long)p_Var22);
        local_138 = (size_type)(int)uVar27;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2e8,local_138,
                   (allocator_type *)&local_288);
        uVar19 = local_2e8._0_8_;
        pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
        p_Var22 = pp_Var23[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var22)) {
          iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var22);
          iVar29 = *(int *)(&this->field_0xdc + (long)p_Var22);
          iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var22);
          iVar26 = 0;
          fVar30 = 0.0;
          iVar31 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var22)) {
              lVar35 = 0;
              do {
                *(float *)(local_2e8._0_8_ + (iVar31 + lVar35) * 4) = fVar30;
                p_Var22 = pp_Var23[-3];
                fVar30 = (float)((int)fVar30 + *(int *)(&this->field_0xdc + (long)p_Var22));
                lVar35 = lVar35 + 1;
              } while ((int)lVar35 < *(int *)(&this->field_0xd4 + (long)p_Var22));
              iVar31 = iVar31 + (int)lVar35;
            }
            fVar30 = (float)((int)fVar30 + (iVar34 * iVar37 - iVar29 * iVar28));
            iVar26 = iVar26 + 1;
          } while (iVar26 < *(int *)(&this->field_0xd8 + (long)p_Var22));
        }
        if (0 < *(int *)(&this->field_0x108 + (long)p_Var22)) {
          local_1e0 = 0;
          lVar35 = 0;
          do {
            if (-1 < (int)local_238) {
              local_230 = (pointer)(local_228.cstep * lVar35 *
                                    CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize
                                            ) + (long)local_228.data);
              local_2f0 = (float *)(top_blob->cstep * lVar35 * top_blob->elemsize +
                                   (long)top_blob->data);
              local_1d0 = (long)local_228.w *
                          CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
              lVar42 = *(long *)(&this->field_0x168 + (long)p_Var22) + local_1e0;
              local_1d8 = 0;
              local_298 = local_2f0;
              do {
                if (-1 < iVar24) {
                  local_290 = (pointer)(long)(int)local_1d8;
                  iVar37 = 0;
                  do {
                    p_Var22 = pp_Var23[-3];
                    fVar60 = 0.0;
                    fVar30 = 0.0;
                    if (0 < (int)uVar27) {
                      uVar39 = 0;
                      iVar29 = 0;
                      do {
                        iVar29 = iVar29 + (int)*(char *)(lVar42 + uVar39) *
                                          (int)*(char *)((long)local_230 +
                                                        (long)(int)*(pointer)(uVar19 + uVar39 * 4) +
                                                        (long)*(int *)(&this->field_0xe8 +
                                                                      (long)p_Var22) *
                                                        (long)local_290 * local_1d0 +
                                                        (long)iVar37 *
                                                        (long)*(int *)(&this->field_0xe4 +
                                                                      (long)p_Var22));
                        uVar39 = uVar39 + 1;
                      } while (uVar27 != uVar39);
                      fVar30 = (float)iVar29;
                    }
                    fVar61 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var22) + lVar35 * 4);
                    if (fVar61 != 0.0) {
                      fVar60 = 1.0 / (fVar61 * *(float *)(*(long *)(&this->field_0x240 +
                                                                   (long)p_Var22) + lVar35 * 4));
                    }
                    fVar60 = fVar60 * fVar30;
                    if (*(int *)(&this->field_0x100 + (long)p_Var22) != 0) {
                      fVar60 = fVar60 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var22) +
                                                  lVar35 * 4);
                    }
                    fVar30 = fVar60;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var22)) {
                    case 1:
                      if (fVar60 <= 0.0) {
                        fVar30 = 0.0;
                      }
                      break;
                    case 2:
                      fVar30 = (float)(-(uint)(0.0 < fVar60) & 0x3f800000 |
                                      ~-(uint)(0.0 < fVar60) &
                                      **(uint **)(&this->field_0x118 + (long)p_Var22)) * fVar60;
                      break;
                    case 3:
                      fVar30 = **(float **)(&this->field_0x118 + (long)p_Var22);
                      if (fVar60 <= fVar30) {
                        fVar60 = fVar30;
                      }
                      fVar61 = (*(float **)(&this->field_0x118 + (long)p_Var22))[1];
                      fVar30 = fVar60;
                      if (fVar61 <= fVar60) {
                        fVar30 = fVar61;
                      }
                      break;
                    case 4:
                      fVar30 = expf(-fVar60);
                      fVar30 = 1.0 / (fVar30 + 1.0);
                      break;
                    case 5:
                      local_e8 = ZEXT416((uint)fVar60);
                      fVar30 = expf(fVar60);
                      fVar30 = logf(fVar30 + 1.0);
                      fVar30 = tanhf(fVar30);
                      fVar30 = fVar30 * (float)local_e8._0_4_;
                      break;
                    case 6:
                      fVar61 = **(float **)(&this->field_0x118 + (long)p_Var22);
                      fVar62 = (*(float **)(&this->field_0x118 + (long)p_Var22))[1];
                      fVar64 = -fVar62 / fVar61;
                      fVar30 = 0.0;
                      if ((fVar64 <= fVar60) && (fVar30 = fVar60, fVar60 <= fVar64 + 1.0 / fVar61))
                      {
                        fVar30 = (fVar61 * fVar60 + fVar62) * fVar60;
                      }
                    }
                    if (iVar40 < 0x65) {
                      *local_298 = fVar30;
                      local_298 = local_298 + 1;
                    }
                    else {
                      fVar30 = roundf(fVar30 * *(float *)(*(long *)(&this->field_0x288 +
                                                                   (long)p_Var22) + lVar35 * 4));
                      iVar29 = (int)fVar30;
                      if (iVar29 < -0x7e) {
                        iVar29 = -0x7f;
                      }
                      uVar20 = (undefined1)iVar29;
                      if (0x7e < iVar29) {
                        uVar20 = 0x7f;
                      }
                      *(undefined1 *)local_2f0 = uVar20;
                      local_2f0 = (float *)((long)local_2f0 + 1);
                    }
                    bVar43 = iVar37 != iVar24;
                    iVar37 = iVar37 + 1;
                  } while (bVar43);
                }
                iVar37 = (int)local_1d8;
                local_1d8 = (ulong)(iVar37 + 1);
              } while (iVar37 != (int)local_238);
            }
            p_Var22 = pp_Var23[-3];
            lVar35 = lVar35 + 1;
            local_1e0 = local_1e0 + local_138;
          } while (lVar35 < *(int *)(&this->field_0x108 + (long)p_Var22));
        }
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          uVar39 = local_2e8._16_8_ - local_2e8._0_8_;
          goto LAB_0027b9c9;
        }
      }
    }
    else {
      if (iVar28 != 8) goto LAB_0027bab6;
      uVar39 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2e8,uVar39,(allocator_type *)&local_288)
      ;
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var22 = pp_Var23[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var22)) {
        iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var22);
        iVar29 = *(int *)(&this->field_0xdc + (long)p_Var22);
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var22);
        iVar26 = 0;
        fVar30 = 0.0;
        iVar31 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var22)) {
            lVar35 = 0;
            do {
              *(float *)(local_2e8._0_8_ + (iVar26 + lVar35) * 4) = fVar30;
              p_Var22 = pp_Var23[-3];
              fVar30 = (float)((int)fVar30 + *(int *)(&this->field_0xdc + (long)p_Var22));
              lVar35 = lVar35 + 1;
            } while ((int)lVar35 < *(int *)(&this->field_0xd4 + (long)p_Var22));
            iVar26 = iVar26 + (int)lVar35;
          }
          fVar30 = (float)((int)fVar30 + (iVar34 * iVar37 - iVar29 * iVar28));
          iVar31 = iVar31 + 1;
        } while (iVar31 < *(int *)(&this->field_0xd8 + (long)p_Var22));
      }
      auVar18 = _DAT_003144b0;
      if (0 < (int)local_230) {
        iVar29 = (int)uVar39 * 8;
        local_1d0 = CONCAT44(local_1d0._4_4_,iVar29);
        iVar37 = 0;
        fVar30 = (float)DAT_003144b0;
        fVar60 = DAT_003144b0._4_4_;
        fVar61 = DAT_003144b0._8_4_;
        fVar62 = DAT_003144b0._12_4_;
        local_290 = (pointer)0x0;
        do {
          if (-1 < (int)local_238) {
            local_298 = (float *)(local_228.cstep * (long)local_290 *
                                  CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize)
                                 + (long)local_228.data);
            pauVar32 = (undefined1 (*) [16])
                       (top_blob->cstep * (long)local_290 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
            pvVar8 = (this->weight_data_int8).data;
            pauVar38 = pauVar32;
            iVar28 = 0;
            do {
              if (-1 < iVar24) {
                iVar34 = 0;
                do {
                  p_Var22 = pp_Var23[-3];
                  if ((int)uVar39 < 1) {
                    auVar114 = ZEXT816(0);
                    auVar72 = ZEXT816(0);
                  }
                  else {
                    iVar26 = 0;
                    iVar31 = 0;
                    iVar54 = 0;
                    iVar57 = 0;
                    uVar41 = 0;
                    iVar63 = 0;
                    iVar75 = 0;
                    iVar77 = 0;
                    iVar79 = 0;
                    do {
                      uVar7 = *(ulong *)((long)local_298 +
                                        (long)(int)*(pointer)(local_2e8._0_8_ + uVar41 * 4) * 8 +
                                        (long)*(int *)(&this->field_0xe8 + (long)p_Var22) *
                                        (long)iVar28 *
                                        (long)local_228.w *
                                        CONCAT44(local_228.elemsize._4_4_,
                                                 (undefined4)local_228.elemsize) +
                                        (long)(*(int *)(&this->field_0xe4 + (long)p_Var22) * iVar34
                                              * 8));
                      cVar93 = (char)(uVar7 >> 8);
                      cVar94 = (char)(uVar7 >> 0x10);
                      cVar95 = (char)(uVar7 >> 0x18);
                      cVar96 = (char)(uVar7 >> 0x20);
                      cVar99 = (char)(uVar7 >> 0x28);
                      cVar100 = (char)(uVar7 >> 0x30);
                      auVar88._8_6_ = 0;
                      auVar88._0_8_ = uVar7;
                      auVar88[0xe] = (char)(uVar7 >> 0x38);
                      auVar88[0xf] = -((long)uVar7 < 0);
                      auVar87._14_2_ = auVar88._14_2_;
                      auVar87._8_5_ = 0;
                      auVar87._0_8_ = uVar7;
                      auVar87[0xd] = -(cVar100 < '\0');
                      auVar86._13_3_ = auVar87._13_3_;
                      auVar86._8_4_ = 0;
                      auVar86._0_8_ = uVar7;
                      auVar86[0xc] = cVar100;
                      auVar85._12_4_ = auVar86._12_4_;
                      auVar85._8_3_ = 0;
                      auVar85._0_8_ = uVar7;
                      auVar85[0xb] = -(cVar99 < '\0');
                      auVar116._11_5_ = auVar85._11_5_;
                      auVar116._8_2_ = 0;
                      auVar116._0_8_ = uVar7;
                      auVar116[10] = cVar99;
                      auVar131._10_6_ = auVar116._10_6_;
                      auVar131[8] = 0;
                      auVar131._0_8_ = uVar7;
                      auVar131[9] = -(cVar96 < '\0');
                      auVar84._9_7_ = auVar131._9_7_;
                      auVar84[8] = cVar96;
                      auVar84._0_8_ = uVar7;
                      Var13 = CONCAT91(CONCAT81(auVar84._8_8_,-(cVar95 < '\0')),cVar95);
                      auVar12._2_10_ = Var13;
                      auVar12[1] = -(cVar94 < '\0');
                      auVar12[0] = cVar94;
                      auVar11._2_12_ = auVar12;
                      auVar11[1] = -(cVar93 < '\0');
                      auVar11[0] = cVar93;
                      auVar83._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar83._2_14_ = auVar11;
                      uVar7 = *(ulong *)((long)pvVar8 + uVar41 * 8 + (long)iVar37);
                      cVar93 = (char)(uVar7 >> 8);
                      cVar94 = (char)(uVar7 >> 0x10);
                      cVar95 = (char)(uVar7 >> 0x18);
                      cVar96 = (char)(uVar7 >> 0x20);
                      cVar99 = (char)(uVar7 >> 0x28);
                      cVar100 = (char)(uVar7 >> 0x30);
                      auVar113._8_6_ = 0;
                      auVar113._0_8_ = uVar7;
                      auVar113[0xe] = (char)(uVar7 >> 0x38);
                      auVar113[0xf] = -((long)uVar7 < 0);
                      auVar112._14_2_ = auVar113._14_2_;
                      auVar112._8_5_ = 0;
                      auVar112._0_8_ = uVar7;
                      auVar112[0xd] = -(cVar100 < '\0');
                      auVar111._13_3_ = auVar112._13_3_;
                      auVar111._8_4_ = 0;
                      auVar111._0_8_ = uVar7;
                      auVar111[0xc] = cVar100;
                      auVar110._12_4_ = auVar111._12_4_;
                      auVar110._8_3_ = 0;
                      auVar110._0_8_ = uVar7;
                      auVar110[0xb] = -(cVar99 < '\0');
                      auVar109._11_5_ = auVar110._11_5_;
                      auVar109._8_2_ = 0;
                      auVar109._0_8_ = uVar7;
                      auVar109[10] = cVar99;
                      auVar108._10_6_ = auVar109._10_6_;
                      auVar108[8] = 0;
                      auVar108._0_8_ = uVar7;
                      auVar108[9] = -(cVar96 < '\0');
                      auVar107._9_7_ = auVar108._9_7_;
                      auVar107[8] = cVar96;
                      auVar107._0_8_ = uVar7;
                      Var16 = CONCAT91(CONCAT81(auVar107._8_8_,-(cVar95 < '\0')),cVar95);
                      auVar15._2_10_ = Var16;
                      auVar15[1] = -(cVar94 < '\0');
                      auVar15[0] = cVar94;
                      auVar14._2_12_ = auVar15;
                      auVar14[1] = -(cVar93 < '\0');
                      auVar14[0] = cVar93;
                      auVar106._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar106._2_14_ = auVar14;
                      sVar129 = (short)Var16 * (short)Var13;
                      auVar114 = pmulhw(auVar106,auVar83);
                      iVar124 = CONCAT22(auVar114._6_2_,sVar129);
                      Var13 = CONCAT64(CONCAT42(iVar124,auVar114._4_2_),
                                       CONCAT22(auVar15._0_2_ * auVar12._0_2_,sVar129));
                      auVar17._4_8_ = (long)((unkuint10)Var13 >> 0x10);
                      auVar17._2_2_ = auVar114._2_2_;
                      auVar17._0_2_ = auVar14._0_2_ * auVar11._0_2_;
                      iVar26 = iVar26 + CONCAT22(auVar114._0_2_,auVar106._0_2_ * auVar83._0_2_);
                      iVar31 = iVar31 + auVar17._0_4_;
                      iVar54 = iVar54 + (int)((unkuint10)Var13 >> 0x10);
                      iVar57 = iVar57 + iVar124;
                      iVar124 = CONCAT22(auVar114._8_2_,auVar107._8_2_ * auVar84._8_2_);
                      auVar125._0_8_ =
                           CONCAT26(auVar114._10_2_,
                                    CONCAT24(auVar109._10_2_ * auVar116._10_2_,iVar124));
                      auVar125._8_2_ = auVar111._12_2_ * auVar86._12_2_;
                      auVar125._10_2_ = auVar114._12_2_;
                      auVar126._12_2_ = auVar112._14_2_ * auVar87._14_2_;
                      auVar126._0_12_ = auVar125;
                      auVar126._14_2_ = auVar114._14_2_;
                      iVar63 = iVar63 + iVar124;
                      iVar75 = iVar75 + (int)((ulong)auVar125._0_8_ >> 0x20);
                      iVar77 = iVar77 + auVar125._8_4_;
                      iVar79 = iVar79 + auVar126._12_4_;
                      uVar41 = uVar41 + 1;
                    } while ((uVar39 & 0xffffffff) != uVar41);
                    auVar72._0_4_ = (float)iVar26;
                    auVar72._4_4_ = (float)iVar31;
                    auVar72._8_4_ = (float)iVar54;
                    auVar72._12_4_ = (float)iVar57;
                    auVar114._0_4_ = (float)iVar63;
                    auVar114._4_4_ = (float)iVar75;
                    auVar114._8_4_ = (float)iVar77;
                    auVar114._12_4_ = (float)iVar79;
                  }
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var22) +
                                    (long)local_290 * 0x20);
                  pfVar3 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var22) + 0x10 +
                                    (long)local_290 * 0x20);
                  pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var22) +
                                    (long)local_290 * 0x20);
                  pfVar4 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var22) + 0x10 +
                                    (long)local_290 * 0x20);
                  auVar115._0_4_ = *pfVar1 * *pfVar2;
                  auVar115._4_4_ = pfVar1[1] * pfVar2[1];
                  auVar115._8_4_ = pfVar1[2] * pfVar2[2];
                  auVar115._12_4_ = pfVar1[3] * pfVar2[3];
                  auVar116 = rcpps(auVar115,auVar115);
                  auVar130._0_4_ = *pfVar3 * *pfVar4;
                  auVar130._4_4_ = pfVar3[1] * pfVar4[1];
                  auVar130._8_4_ = pfVar3[2] * pfVar4[2];
                  auVar130._12_4_ = pfVar3[3] * pfVar4[3];
                  auVar131 = rcpps(auVar130,auVar130);
                  auVar44._0_12_ = ZEXT812(0);
                  auVar44._12_4_ = 0;
                  auVar46._0_4_ = (float)(-(uint)(*pfVar2 != 0.0) & auVar116._0_4_) * auVar72._0_4_;
                  auVar46._4_4_ =
                       (float)(-(uint)(pfVar2[1] != 0.0) & auVar116._4_4_) * auVar72._4_4_;
                  auVar46._8_4_ =
                       (float)(-(uint)(pfVar2[2] != 0.0) & auVar116._8_4_) * auVar72._8_4_;
                  auVar46._12_4_ =
                       (float)(-(uint)(pfVar2[3] != 0.0) & auVar116._12_4_) * auVar72._12_4_;
                  auVar127._0_4_ =
                       (float)(-(uint)(*pfVar4 != 0.0) & auVar131._0_4_) * auVar114._0_4_;
                  auVar127._4_4_ =
                       (float)(-(uint)(pfVar4[1] != 0.0) & auVar131._4_4_) * auVar114._4_4_;
                  auVar127._8_4_ =
                       (float)(-(uint)(pfVar4[2] != 0.0) & auVar131._8_4_) * auVar114._8_4_;
                  auVar127._12_4_ =
                       (float)(-(uint)(pfVar4[3] != 0.0) & auVar131._12_4_) * auVar114._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var22) != 0) {
                    auVar114 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1b0 + (long)p_Var22) +
                                (long)local_290 * 0x20);
                    auVar72 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var22) + 0x10 +
                               (long)local_290 * 0x20);
                    auVar46._0_4_ = auVar46._0_4_ + auVar114._0_4_;
                    auVar46._4_4_ = auVar46._4_4_ + auVar114._4_4_;
                    auVar46._8_4_ = auVar46._8_4_ + auVar114._8_4_;
                    auVar46._12_4_ = auVar46._12_4_ + auVar114._12_4_;
                    auVar127._0_4_ = auVar127._0_4_ + auVar72._0_4_;
                    auVar127._4_4_ = auVar127._4_4_ + auVar72._4_4_;
                    auVar127._8_4_ = auVar127._8_4_ + auVar72._8_4_;
                    auVar127._12_4_ = auVar127._12_4_ + auVar72._12_4_;
                  }
                  fVar64 = auVar46._0_4_;
                  fVar76 = auVar46._4_4_;
                  fVar78 = auVar46._8_4_;
                  fVar80 = auVar46._12_4_;
                  fVar82 = auVar127._0_4_;
                  fVar98 = auVar127._4_4_;
                  fVar102 = auVar127._8_4_;
                  fVar104 = auVar127._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var22)) {
                  case 1:
                    auVar46 = maxps(auVar46,auVar44);
                    auVar127 = maxps(auVar127,auVar44);
                    break;
                  case 2:
                    auVar72 = maxps(auVar46,auVar44);
                    auVar114 = minps(auVar46,auVar44);
                    fVar64 = **(float **)(&this->field_0x118 + (long)p_Var22);
                    auVar46._0_4_ = auVar114._0_4_ * fVar64 + auVar72._0_4_;
                    auVar46._4_4_ = auVar114._4_4_ * fVar64 + auVar72._4_4_;
                    auVar46._8_4_ = auVar114._8_4_ * fVar64 + auVar72._8_4_;
                    auVar46._12_4_ = auVar114._12_4_ * fVar64 + auVar72._12_4_;
                    auVar114 = maxps(auVar127,auVar44);
                    auVar72 = minps(auVar127,auVar44);
                    auVar127._0_4_ = auVar72._0_4_ * fVar64 + auVar114._0_4_;
                    auVar127._4_4_ = auVar72._4_4_ * fVar64 + auVar114._4_4_;
                    auVar127._8_4_ = auVar72._8_4_ * fVar64 + auVar114._8_4_;
                    auVar127._12_4_ = auVar72._12_4_ * fVar64 + auVar114._12_4_;
                    break;
                  case 3:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var22);
                    uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var22))[1];
                    auVar69._4_4_ = uVar5;
                    auVar69._0_4_ = uVar5;
                    auVar69._8_4_ = uVar5;
                    auVar69._12_4_ = uVar5;
                    auVar90._4_4_ = uVar6;
                    auVar90._0_4_ = uVar6;
                    auVar90._8_4_ = uVar6;
                    auVar90._12_4_ = uVar6;
                    auVar114 = maxps(auVar46,auVar69);
                    auVar46 = minps(auVar114,auVar90);
                    auVar114 = maxps(auVar127,auVar69);
                    auVar127 = minps(auVar114,auVar90);
                    break;
                  case 4:
                    auVar47._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
                    auVar47._8_4_ = -fVar78;
                    auVar47._12_4_ = -fVar80;
                    auVar114 = minps(auVar47,_DAT_003144c0);
                    auVar114 = maxps(auVar114,_DAT_003144d0);
                    fVar64 = auVar114._0_4_ * 1.442695 + 0.5;
                    fVar76 = auVar114._4_4_ * 1.442695 + 0.5;
                    fVar78 = auVar114._8_4_ * 1.442695 + 0.5;
                    fVar80 = auVar114._12_4_ * 1.442695 + 0.5;
                    fVar82 = (float)(int)fVar64;
                    fVar98 = (float)(int)fVar76;
                    fVar105 = (float)(int)fVar78;
                    fVar121 = (float)(int)fVar80;
                    fVar82 = fVar82 - (float)(-(uint)(fVar64 < fVar82) & (uint)fVar30);
                    fVar98 = fVar98 - (float)(-(uint)(fVar76 < fVar98) & (uint)fVar60);
                    fVar105 = fVar105 - (float)(-(uint)(fVar78 < fVar105) & (uint)fVar61);
                    fVar121 = fVar121 - (float)(-(uint)(fVar80 < fVar121) & (uint)fVar62);
                    fVar64 = auVar114._0_4_ - fVar82 * 0.6931472;
                    fVar76 = auVar114._4_4_ - fVar98 * 0.6931472;
                    fVar78 = auVar114._8_4_ - fVar105 * 0.6931472;
                    fVar80 = auVar114._12_4_ - fVar121 * 0.6931472;
                    auVar70._0_4_ = fVar64 * fVar64;
                    auVar70._4_4_ = fVar76 * fVar76;
                    auVar70._8_4_ = fVar78 * fVar78;
                    auVar70._12_4_ = fVar80 * fVar80;
                    auVar91._0_4_ =
                         (float)((int)fVar82 * 0x800000 + (int)fVar30) *
                         (fVar64 + fVar30 +
                         (((((fVar64 * (float)DAT_00314510 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + (float)DAT_00314550) * fVar64 + 0.5) *
                         auVar70._0_4_) + fVar30;
                    auVar91._4_4_ =
                         (float)((int)fVar98 * 0x800000 + (int)fVar60) *
                         (fVar76 + fVar60 +
                         (((((fVar76 * DAT_00314510._4_4_ + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + DAT_00314550._4_4_) * fVar76 + 0.5) *
                         auVar70._4_4_) + fVar60;
                    auVar91._8_4_ =
                         (float)((int)fVar105 * 0x800000 + (int)fVar61) *
                         (fVar78 + fVar61 +
                         (((((fVar78 * DAT_00314510._8_4_ + 0.0013981999) * fVar78 + 0.008333452) *
                            fVar78 + 0.041665796) * fVar78 + DAT_00314550._8_4_) * fVar78 + 0.5) *
                         auVar70._8_4_) + fVar61;
                    auVar91._12_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar62) *
                         (fVar80 + fVar62 +
                         (((((fVar80 * DAT_00314510._12_4_ + 0.0013981999) * fVar80 + 0.008333452) *
                            fVar80 + 0.041665796) * fVar80 + DAT_00314550._12_4_) * fVar80 + 0.5) *
                         auVar70._12_4_) + fVar62;
                    auVar114 = rcpps(auVar70,auVar91);
                    fVar64 = auVar114._0_4_;
                    fVar76 = auVar114._4_4_;
                    fVar78 = auVar114._8_4_;
                    fVar80 = auVar114._12_4_;
                    auVar46._0_4_ = (fVar30 - auVar91._0_4_ * fVar64) * fVar64 + fVar64;
                    auVar46._4_4_ = (fVar60 - auVar91._4_4_ * fVar76) * fVar76 + fVar76;
                    auVar46._8_4_ = (fVar61 - auVar91._8_4_ * fVar78) * fVar78 + fVar78;
                    auVar46._12_4_ = (fVar62 - auVar91._12_4_ * fVar80) * fVar80 + fVar80;
                    auVar128._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
                    auVar128._8_4_ = -fVar102;
                    auVar128._12_4_ = -fVar104;
                    auVar114 = minps(auVar128,_DAT_003144c0);
                    auVar114 = maxps(auVar114,_DAT_003144d0);
                    fVar82 = auVar114._0_4_ * 1.442695 + 0.5;
                    fVar98 = auVar114._4_4_ * 1.442695 + 0.5;
                    fVar102 = auVar114._8_4_ * 1.442695 + 0.5;
                    fVar104 = auVar114._12_4_ * 1.442695 + 0.5;
                    fVar64 = (float)(int)fVar82;
                    fVar76 = (float)(int)fVar98;
                    fVar78 = (float)(int)fVar102;
                    fVar80 = (float)(int)fVar104;
                    fVar64 = fVar64 - (float)(-(uint)(fVar82 < fVar64) & (uint)fVar30);
                    fVar76 = fVar76 - (float)(-(uint)(fVar98 < fVar76) & (uint)fVar60);
                    fVar78 = fVar78 - (float)(-(uint)(fVar102 < fVar78) & (uint)fVar61);
                    fVar80 = fVar80 - (float)(-(uint)(fVar104 < fVar80) & (uint)fVar62);
                    fVar82 = auVar114._0_4_ - fVar64 * 0.6931472;
                    fVar98 = auVar114._4_4_ - fVar76 * 0.6931472;
                    fVar102 = auVar114._8_4_ - fVar78 * 0.6931472;
                    fVar104 = auVar114._12_4_ - fVar80 * 0.6931472;
                    auVar92._0_4_ = fVar82 * fVar82;
                    auVar92._4_4_ = fVar98 * fVar98;
                    auVar92._8_4_ = fVar102 * fVar102;
                    auVar92._12_4_ = fVar104 * fVar104;
                    auVar71._0_4_ =
                         (float)((int)fVar64 * 0x800000 + (int)fVar30) *
                         (fVar82 + fVar30 +
                         (((((fVar82 * (float)DAT_00314510 + 0.0013981999) * fVar82 + 0.008333452) *
                            fVar82 + 0.041665796) * fVar82 + (float)DAT_00314550) * fVar82 + 0.5) *
                         auVar92._0_4_) + fVar30;
                    auVar71._4_4_ =
                         (float)((int)fVar76 * 0x800000 + (int)fVar60) *
                         (fVar98 + fVar60 +
                         (((((fVar98 * DAT_00314510._4_4_ + 0.0013981999) * fVar98 + 0.008333452) *
                            fVar98 + 0.041665796) * fVar98 + DAT_00314550._4_4_) * fVar98 + 0.5) *
                         auVar92._4_4_) + fVar60;
                    auVar71._8_4_ =
                         (float)((int)fVar78 * 0x800000 + (int)fVar61) *
                         (fVar102 + fVar61 +
                         (((((fVar102 * DAT_00314510._8_4_ + 0.0013981999) * fVar102 + 0.008333452)
                            * fVar102 + 0.041665796) * fVar102 + DAT_00314550._8_4_) * fVar102 + 0.5
                         ) * auVar92._8_4_) + fVar61;
                    auVar71._12_4_ =
                         (float)((int)fVar80 * 0x800000 + (int)fVar62) *
                         (fVar104 + fVar62 +
                         (((((fVar104 * DAT_00314510._12_4_ + 0.0013981999) * fVar104 + 0.008333452)
                            * fVar104 + 0.041665796) * fVar104 + DAT_00314550._12_4_) * fVar104 +
                         0.5) * auVar92._12_4_) + fVar62;
                    auVar114 = rcpps(auVar92,auVar71);
                    fVar64 = auVar114._0_4_;
                    fVar76 = auVar114._4_4_;
                    fVar78 = auVar114._8_4_;
                    fVar80 = auVar114._12_4_;
                    auVar127._0_4_ = (fVar30 - auVar71._0_4_ * fVar64) * fVar64 + fVar64;
                    auVar127._4_4_ = (fVar60 - auVar71._4_4_ * fVar76) * fVar76 + fVar76;
                    auVar127._8_4_ = (fVar61 - auVar71._8_4_ * fVar78) * fVar78 + fVar78;
                    auVar127._12_4_ = (fVar62 - auVar71._12_4_ * fVar80) * fVar80 + fVar80;
                    break;
                  case 5:
                    auVar114 = minps(auVar46,_DAT_003144c0);
                    auVar114 = maxps(auVar114,_DAT_003144d0);
                    fVar105 = auVar114._0_4_ * 1.442695 + 0.5;
                    fVar121 = auVar114._4_4_ * 1.442695 + 0.5;
                    fVar122 = auVar114._8_4_ * 1.442695 + 0.5;
                    fVar123 = auVar114._12_4_ * 1.442695 + 0.5;
                    fVar81 = (float)(int)fVar105;
                    fVar97 = (float)(int)fVar121;
                    fVar101 = (float)(int)fVar122;
                    fVar103 = (float)(int)fVar123;
                    fVar81 = fVar81 - (float)(-(uint)(fVar105 < fVar81) & (uint)fVar30);
                    fVar97 = fVar97 - (float)(-(uint)(fVar121 < fVar97) & (uint)fVar60);
                    fVar101 = fVar101 - (float)(-(uint)(fVar122 < fVar101) & (uint)fVar61);
                    fVar103 = fVar103 - (float)(-(uint)(fVar123 < fVar103) & (uint)fVar62);
                    fVar105 = auVar114._0_4_ - fVar81 * 0.6931472;
                    fVar121 = auVar114._4_4_ - fVar97 * 0.6931472;
                    fVar122 = auVar114._8_4_ - fVar101 * 0.6931472;
                    fVar123 = auVar114._12_4_ - fVar103 * 0.6931472;
                    auVar132._0_4_ =
                         (float)((int)fVar81 * 0x800000 + (int)fVar30) *
                         (fVar105 + fVar30 +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105) + fVar30;
                    auVar132._4_4_ =
                         (float)((int)fVar97 * 0x800000 + (int)fVar60) *
                         (fVar121 + fVar60 +
                         (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) *
                            fVar121 + 0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5) *
                         fVar121 * fVar121) + fVar60;
                    auVar132._8_4_ =
                         (float)((int)fVar101 * 0x800000 + (int)fVar61) *
                         (fVar122 + fVar61 +
                         (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) *
                            fVar122 + 0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5) *
                         fVar122 * fVar122) + fVar61;
                    auVar132._12_4_ =
                         (float)((int)fVar103 * 0x800000 + (int)fVar62) *
                         (fVar123 + fVar62 +
                         (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) *
                            fVar123 + 0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5) *
                         fVar123 * fVar123) + fVar62;
                    auVar114 = maxps(auVar132,_DAT_00314560);
                    fVar105 = (float)(auVar114._0_4_ & 0x807fffff | 0x3f000000);
                    fVar122 = (float)(auVar114._4_4_ & 0x807fffff | 0x3f000000);
                    fVar81 = (float)(auVar114._8_4_ & 0x807fffff | 0x3f000000);
                    fVar101 = (float)(auVar114._12_4_ & 0x807fffff | 0x3f000000);
                    fVar121 = fVar105 + -1.0 +
                              (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                    fVar123 = fVar122 + -1.0 +
                              (float)(-(uint)(fVar122 < 0.70710677) & (uint)fVar122);
                    fVar97 = fVar81 + -1.0 + (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
                    fVar103 = fVar101 + -1.0 +
                              (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar101);
                    auVar65._0_8_ =
                         CONCAT44(-(uint)(auVar132._4_4_ <= 0.0),-(uint)(auVar132._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar65._8_4_ = -(uint)(auVar132._8_4_ <= 0.0) & 0x7fffffff;
                    auVar65._12_4_ = -(uint)(auVar132._12_4_ <= 0.0) & 0x7fffffff;
                    auVar117._0_4_ =
                         ~-(uint)(auVar132._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar30)) * 0.6931472
                                 + fVar121 +
                                (((((((((fVar121 * 0.070376836 + -0.1151461) * fVar121 + 0.116769984
                                       ) * fVar121 + -0.12420141) * fVar121 + 0.14249323) * fVar121
                                    + -0.16668057) * fVar121 + 0.20000714) * fVar121 + -0.24999994)
                                  * fVar121 + 0.3333333) * fVar121 + -0.5) * fVar121 * fVar121) *
                               -2.0);
                    auVar117._4_4_ =
                         ~-(uint)(auVar132._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar122 < 0.70710677) & (uint)fVar60)) * 0.6931472
                                 + fVar123 +
                                (((((((((fVar123 * 0.070376836 + -0.1151461) * fVar123 + 0.116769984
                                       ) * fVar123 + -0.12420141) * fVar123 + 0.14249323) * fVar123
                                    + -0.16668057) * fVar123 + 0.20000714) * fVar123 + -0.24999994)
                                  * fVar123 + 0.3333333) * fVar123 + -0.5) * fVar123 * fVar123) *
                               -2.0);
                    auVar117._8_4_ =
                         ~-(uint)(auVar132._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                                 fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                                 0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                               0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                             0.20000714) * fVar97 + -0.24999994) * fVar97 +
                                           0.3333333) * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                    auVar117._12_4_ =
                         ~-(uint)(auVar132._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar62)) * 0.6931472
                                 + fVar103 +
                                (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984
                                       ) * fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103
                                    + -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994)
                                  * fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) *
                               -2.0);
                    auVar114 = minps(auVar117 | auVar65,_DAT_003144c0);
                    auVar114 = maxps(auVar114,_DAT_003144d0);
                    fVar81 = auVar114._0_4_ * 1.442695 + 0.5;
                    fVar97 = auVar114._4_4_ * 1.442695 + 0.5;
                    fVar101 = auVar114._8_4_ * 1.442695 + 0.5;
                    fVar103 = auVar114._12_4_ * 1.442695 + 0.5;
                    fVar105 = (float)(int)fVar81;
                    fVar121 = (float)(int)fVar97;
                    fVar122 = (float)(int)fVar101;
                    fVar123 = (float)(int)fVar103;
                    fVar105 = fVar105 - (float)(-(uint)(fVar81 < fVar105) & (uint)fVar30);
                    fVar121 = fVar121 - (float)(-(uint)(fVar97 < fVar121) & (uint)fVar60);
                    fVar122 = fVar122 - (float)(-(uint)(fVar101 < fVar122) & (uint)fVar61);
                    fVar123 = fVar123 - (float)(-(uint)(fVar103 < fVar123) & (uint)fVar62);
                    fVar81 = auVar114._0_4_ - fVar105 * 0.6931472;
                    fVar97 = auVar114._4_4_ - fVar121 * 0.6931472;
                    fVar101 = auVar114._8_4_ - fVar122 * 0.6931472;
                    fVar103 = auVar114._12_4_ - fVar123 * 0.6931472;
                    auVar66._0_4_ = fVar81 * fVar81;
                    auVar66._4_4_ = fVar97 * fVar97;
                    auVar66._8_4_ = fVar101 * fVar101;
                    auVar66._12_4_ = fVar103 * fVar103;
                    auVar89._0_4_ =
                         (float)((int)fVar105 * 0x800000 + (int)fVar30) *
                         (fVar81 + fVar30 +
                         (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) *
                            fVar81 + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) *
                         auVar66._0_4_) + fVar30;
                    auVar89._4_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar60) *
                         (fVar97 + fVar60 +
                         (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                            fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                         auVar66._4_4_) + fVar60;
                    auVar89._8_4_ =
                         (float)((int)fVar122 * 0x800000 + (int)fVar61) *
                         (fVar101 + fVar61 +
                         (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                            fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                         auVar66._8_4_) + fVar61;
                    auVar89._12_4_ =
                         (float)((int)fVar123 * 0x800000 + (int)fVar62) *
                         (fVar103 + fVar62 +
                         (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                            fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                         auVar66._12_4_) + fVar62;
                    auVar114 = rcpps(auVar66,auVar89);
                    fVar105 = auVar114._0_4_;
                    fVar121 = auVar114._4_4_;
                    fVar122 = auVar114._8_4_;
                    fVar123 = auVar114._12_4_;
                    auVar46._0_4_ =
                         fVar64 * (fVar105 + fVar105 + -1.0 +
                                  (2.0 - auVar89._0_4_ * (fVar105 + fVar105)) * fVar105);
                    auVar46._4_4_ =
                         fVar76 * (fVar121 + fVar121 + -1.0 +
                                  (2.0 - auVar89._4_4_ * (fVar121 + fVar121)) * fVar121);
                    auVar46._8_4_ =
                         fVar78 * (fVar122 + fVar122 + -1.0 +
                                  (2.0 - auVar89._8_4_ * (fVar122 + fVar122)) * fVar122);
                    auVar46._12_4_ =
                         fVar80 * (fVar123 + fVar123 + -1.0 +
                                  (2.0 - auVar89._12_4_ * (fVar123 + fVar123)) * fVar123);
                    auVar114 = minps(auVar127,_DAT_003144c0);
                    auVar114 = maxps(auVar114,_DAT_003144d0);
                    fVar64 = auVar114._0_4_ * 1.442695 + 0.5;
                    fVar76 = auVar114._4_4_ * 1.442695 + 0.5;
                    fVar78 = auVar114._8_4_ * 1.442695 + 0.5;
                    fVar80 = auVar114._12_4_ * 1.442695 + 0.5;
                    fVar105 = (float)(int)fVar64;
                    fVar121 = (float)(int)fVar76;
                    fVar122 = (float)(int)fVar78;
                    fVar123 = (float)(int)fVar80;
                    fVar105 = fVar105 - (float)(-(uint)(fVar64 < fVar105) & (uint)fVar30);
                    fVar121 = fVar121 - (float)(-(uint)(fVar76 < fVar121) & (uint)fVar60);
                    fVar122 = fVar122 - (float)(-(uint)(fVar78 < fVar122) & (uint)fVar61);
                    fVar123 = fVar123 - (float)(-(uint)(fVar80 < fVar123) & (uint)fVar62);
                    fVar81 = (float)DAT_00314500;
                    fVar97 = DAT_00314500._4_4_;
                    fVar101 = DAT_00314500._8_4_;
                    fVar103 = DAT_00314500._12_4_;
                    fVar64 = auVar114._0_4_ - fVar105 * fVar81;
                    fVar76 = auVar114._4_4_ - fVar121 * fVar97;
                    fVar78 = auVar114._8_4_ - fVar122 * fVar101;
                    fVar80 = auVar114._12_4_ - fVar123 * fVar103;
                    auVar133._0_4_ =
                         (float)((int)fVar105 * 0x800000 + (int)fVar30) *
                         (fVar64 + fVar30 +
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                         fVar64 * fVar64) + fVar30;
                    auVar133._4_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar60) *
                         (fVar76 + fVar60 +
                         (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) *
                         fVar76 * fVar76) + fVar60;
                    auVar133._8_4_ =
                         (float)((int)fVar122 * 0x800000 + (int)fVar61) *
                         (fVar78 + fVar61 +
                         (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) *
                            fVar78 + 0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) *
                         fVar78 * fVar78) + fVar61;
                    auVar133._12_4_ =
                         (float)((int)fVar123 * 0x800000 + (int)fVar62) *
                         (fVar80 + fVar62 +
                         (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) *
                            fVar80 + 0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) *
                         fVar80 * fVar80) + fVar62;
                    auVar114 = maxps(auVar133,_DAT_00314560);
                    fVar64 = (float)(auVar114._0_4_ & 0x807fffff | 0x3f000000);
                    fVar78 = (float)(auVar114._4_4_ & 0x807fffff | 0x3f000000);
                    fVar105 = (float)(auVar114._8_4_ & 0x807fffff | 0x3f000000);
                    fVar122 = (float)(auVar114._12_4_ & 0x807fffff | 0x3f000000);
                    fVar76 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                    fVar80 = fVar78 + -1.0 + (float)(-(uint)(fVar78 < 0.70710677) & (uint)fVar78);
                    fVar121 = fVar105 + -1.0 +
                              (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                    fVar123 = fVar122 + -1.0 +
                              (float)(-(uint)(fVar122 < 0.70710677) & (uint)fVar122);
                    auVar118._0_8_ =
                         CONCAT44(-(uint)(auVar133._4_4_ <= 0.0),-(uint)(auVar133._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar118._8_4_ = -(uint)(auVar133._8_4_ <= 0.0) & 0x7fffffff;
                    auVar118._12_4_ = -(uint)(auVar133._12_4_ <= 0.0) & 0x7fffffff;
                    auVar67._0_4_ =
                         ~-(uint)(auVar133._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar30)) * fVar81 +
                                 fVar76 + (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 +
                                                 0.116769984) * fVar76 + -0.12420141) * fVar76 +
                                               0.14249323) * fVar76 + -0.16668057) * fVar76 +
                                             0.20000714) * fVar76 + -0.24999994) * fVar76 +
                                           0.3333333) * fVar76 + -0.5) * fVar76 * fVar76) * -2.0);
                    auVar67._4_4_ =
                         ~-(uint)(auVar133._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar78 < 0.70710677) & (uint)fVar60)) * fVar97 +
                                 fVar80 + (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                                 0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                               0.14249323) * fVar80 + -0.16668057) * fVar80 +
                                             0.20000714) * fVar80 + -0.24999994) * fVar80 +
                                           0.3333333) * fVar80 + -0.5) * fVar80 * fVar80) * -2.0);
                    auVar67._8_4_ =
                         ~-(uint)(auVar133._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar61)) * fVar101 +
                                 fVar121 +
                                (((((((((fVar121 * 0.070376836 + -0.1151461) * fVar121 + 0.116769984
                                       ) * fVar121 + -0.12420141) * fVar121 + 0.14249323) * fVar121
                                    + -0.16668057) * fVar121 + 0.20000714) * fVar121 + -0.24999994)
                                  * fVar121 + 0.3333333) * fVar121 + -0.5) * fVar121 * fVar121) *
                               -2.0);
                    auVar67._12_4_ =
                         ~-(uint)(auVar133._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar114._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar122 < 0.70710677) & (uint)fVar62)) * fVar103 +
                                 fVar123 +
                                (((((((((fVar123 * 0.070376836 + -0.1151461) * fVar123 + 0.116769984
                                       ) * fVar123 + -0.12420141) * fVar123 + 0.14249323) * fVar123
                                    + -0.16668057) * fVar123 + 0.20000714) * fVar123 + -0.24999994)
                                  * fVar123 + 0.3333333) * fVar123 + -0.5) * fVar123 * fVar123) *
                               -2.0);
                    auVar114 = minps(auVar67 | auVar118,_DAT_003144c0);
                    auVar114 = maxps(auVar114,_DAT_003144d0);
                    fVar64 = auVar114._0_4_ * 1.442695 + 0.5;
                    fVar76 = auVar114._4_4_ * 1.442695 + 0.5;
                    fVar78 = auVar114._8_4_ * 1.442695 + 0.5;
                    fVar80 = auVar114._12_4_ * 1.442695 + 0.5;
                    fVar105 = (float)(int)fVar64;
                    fVar121 = (float)(int)fVar76;
                    fVar122 = (float)(int)fVar78;
                    fVar123 = (float)(int)fVar80;
                    fVar105 = fVar105 - (float)(-(uint)(fVar64 < fVar105) & (uint)fVar30);
                    fVar121 = fVar121 - (float)(-(uint)(fVar76 < fVar121) & (uint)fVar60);
                    fVar122 = fVar122 - (float)(-(uint)(fVar78 < fVar122) & (uint)fVar61);
                    fVar123 = fVar123 - (float)(-(uint)(fVar80 < fVar123) & (uint)fVar62);
                    fVar64 = auVar114._0_4_ - fVar105 * fVar81;
                    fVar76 = auVar114._4_4_ - fVar121 * fVar97;
                    fVar78 = auVar114._8_4_ - fVar122 * fVar101;
                    fVar80 = auVar114._12_4_ - fVar123 * fVar103;
                    auVar68._0_4_ =
                         fVar64 + fVar30 +
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                         fVar64 * fVar64;
                    auVar68._4_4_ =
                         fVar76 + fVar60 +
                         (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) *
                         fVar76 * fVar76;
                    auVar68._8_4_ =
                         fVar78 + fVar61 +
                         (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) *
                            fVar78 + 0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) *
                         fVar78 * fVar78;
                    auVar68._12_4_ =
                         fVar80 + fVar62 +
                         (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) *
                            fVar80 + 0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) *
                         fVar80 * fVar80;
                    auVar119._0_4_ =
                         (float)((int)fVar105 * 0x800000 + (int)fVar30) * auVar68._0_4_ + fVar30;
                    auVar119._4_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar60) * auVar68._4_4_ + fVar60;
                    auVar119._8_4_ =
                         (float)((int)fVar122 * 0x800000 + (int)fVar61) * auVar68._8_4_ + fVar61;
                    auVar119._12_4_ =
                         (float)((int)fVar123 * 0x800000 + (int)fVar62) * auVar68._12_4_ + fVar62;
                    auVar114 = rcpps(auVar68,auVar119);
                    fVar64 = auVar114._0_4_;
                    fVar76 = auVar114._4_4_;
                    fVar78 = auVar114._8_4_;
                    fVar80 = auVar114._12_4_;
                    auVar127._0_4_ =
                         fVar82 * (fVar64 + fVar64 + -1.0 +
                                  (2.0 - auVar119._0_4_ * (fVar64 + fVar64)) * fVar64);
                    auVar127._4_4_ =
                         fVar98 * (fVar76 + fVar76 + -1.0 +
                                  (2.0 - auVar119._4_4_ * (fVar76 + fVar76)) * fVar76);
                    auVar127._8_4_ =
                         fVar102 * (fVar78 + fVar78 + -1.0 +
                                   (2.0 - auVar119._8_4_ * (fVar78 + fVar78)) * fVar78);
                    auVar127._12_4_ =
                         fVar104 * (fVar80 + fVar80 + -1.0 +
                                   (2.0 - auVar119._12_4_ * (fVar80 + fVar80)) * fVar80);
                    break;
                  case 6:
                    fVar105 = **(float **)(&this->field_0x118 + (long)p_Var22);
                    fVar121 = (*(float **)(&this->field_0x118 + (long)p_Var22))[1];
                    auVar120._0_4_ = fVar105 * fVar64 + fVar121;
                    auVar120._4_4_ = fVar105 * fVar76 + fVar121;
                    auVar120._8_4_ = fVar105 * fVar78 + fVar121;
                    auVar120._12_4_ = fVar105 * fVar80 + fVar121;
                    auVar114 = maxps(auVar120,auVar44);
                    auVar114 = minps(auVar114,auVar18);
                    auVar46._0_4_ = fVar64 * auVar114._0_4_;
                    auVar46._4_4_ = fVar76 * auVar114._4_4_;
                    auVar46._8_4_ = fVar78 * auVar114._8_4_;
                    auVar46._12_4_ = fVar80 * auVar114._12_4_;
                    auVar73._0_4_ = fVar105 * fVar82 + fVar121;
                    auVar73._4_4_ = fVar105 * fVar98 + fVar121;
                    auVar73._8_4_ = fVar105 * fVar102 + fVar121;
                    auVar73._12_4_ = fVar105 * fVar104 + fVar121;
                    auVar114 = maxps(auVar73,auVar44);
                    auVar114 = minps(auVar114,auVar18);
                    auVar127._0_4_ = fVar82 * auVar114._0_4_;
                    auVar127._4_4_ = fVar98 * auVar114._4_4_;
                    auVar127._8_4_ = fVar102 * auVar114._8_4_;
                    auVar127._12_4_ = fVar104 * auVar114._12_4_;
                  }
                  if (iVar40 < 0x65) {
                    *pauVar38 = auVar46;
                    pauVar38[1] = auVar127;
                    pauVar38 = pauVar38 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var22) +
                                      (long)local_290 * 0x20);
                    pfVar2 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var22) + 0x10 +
                                      (long)local_290 * 0x20);
                    fVar64 = *pfVar1 * auVar46._0_4_;
                    fVar76 = pfVar1[1] * auVar46._4_4_;
                    fVar78 = pfVar1[2] * auVar46._8_4_;
                    fVar80 = pfVar1[3] * auVar46._12_4_;
                    fVar82 = *pfVar2 * auVar127._0_4_;
                    fVar98 = pfVar2[1] * auVar127._4_4_;
                    fVar102 = pfVar2[2] * auVar127._8_4_;
                    fVar104 = pfVar2[3] * auVar127._12_4_;
                    auVar48._0_4_ = (int)((float)((uint)fVar64 & 0x80000000 | 0x3f000000) + fVar64);
                    auVar48._4_4_ = (int)((float)((uint)fVar76 & 0x80000000 | 0x3f000000) + fVar76);
                    auVar48._8_4_ = (int)((float)((uint)fVar78 & 0x80000000 | 0x3f000000) + fVar78);
                    auVar48._12_4_ = (int)((float)((uint)fVar80 & 0x80000000 | 0x3f000000) + fVar80)
                    ;
                    auVar74._0_4_ = (int)((float)((uint)fVar82 & 0x80000000 | 0x3f000000) + fVar82);
                    auVar74._4_4_ = (int)((float)((uint)fVar98 & 0x80000000 | 0x3f000000) + fVar98);
                    auVar74._8_4_ =
                         (int)((float)((uint)fVar102 & 0x80000000 | 0x3f000000) + fVar102);
                    auVar74._12_4_ =
                         (int)((float)((uint)fVar104 & 0x80000000 | 0x3f000000) + fVar104);
                    auVar114 = packssdw(auVar48,auVar74);
                    sVar129 = auVar114._0_2_;
                    uVar45 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    sVar129 = auVar114._2_2_;
                    uVar50 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    sVar129 = auVar114._4_2_;
                    uVar51 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    sVar129 = auVar114._6_2_;
                    uVar52 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    sVar129 = auVar114._8_2_;
                    uVar53 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    sVar129 = auVar114._10_2_;
                    uVar55 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    sVar129 = auVar114._12_2_;
                    sVar59 = auVar114._14_2_;
                    uVar56 = (ushort)(0x7f < sVar129) * 0x7f | (ushort)(0x7f >= sVar129) * sVar129;
                    uVar58 = (ushort)(0x7f < sVar59) * 0x7f | (ushort)(0x7f >= sVar59) * sVar59;
                    auVar49._0_2_ =
                         (ushort)((short)uVar45 < -0x7f) * -0x7f | ((short)uVar45 >= -0x7f) * uVar45
                    ;
                    auVar49._2_2_ =
                         (ushort)((short)uVar50 < -0x7f) * -0x7f | ((short)uVar50 >= -0x7f) * uVar50
                    ;
                    auVar49._4_2_ =
                         (ushort)((short)uVar51 < -0x7f) * -0x7f | ((short)uVar51 >= -0x7f) * uVar51
                    ;
                    auVar49._6_2_ =
                         (ushort)((short)uVar52 < -0x7f) * -0x7f | ((short)uVar52 >= -0x7f) * uVar52
                    ;
                    auVar49._8_2_ =
                         (ushort)((short)uVar53 < -0x7f) * -0x7f | ((short)uVar53 >= -0x7f) * uVar53
                    ;
                    auVar49._10_2_ =
                         (ushort)((short)uVar55 < -0x7f) * -0x7f | ((short)uVar55 >= -0x7f) * uVar55
                    ;
                    auVar49._12_2_ =
                         (ushort)((short)uVar56 < -0x7f) * -0x7f | ((short)uVar56 >= -0x7f) * uVar56
                    ;
                    auVar49._14_2_ =
                         (ushort)((short)uVar58 < -0x7f) * -0x7f | ((short)uVar58 >= -0x7f) * uVar58
                    ;
                    auVar114 = packsswb(auVar49,auVar49);
                    *(long *)*pauVar32 = auVar114._0_8_;
                    pauVar32 = (undefined1 (*) [16])((long)*pauVar32 + 8);
                  }
                  bVar43 = iVar34 != iVar24;
                  iVar34 = iVar34 + 1;
                } while (bVar43);
              }
              bVar43 = iVar28 != (int)local_238;
              iVar28 = iVar28 + 1;
            } while (bVar43);
          }
          local_290 = (pointer)((long)local_290 + 1);
          iVar37 = iVar37 + iVar29;
        } while (local_290 != local_230);
      }
      if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
        uVar39 = local_2e8._16_8_ - local_2e8._0_8_;
LAB_0027b9c9:
        operator_delete((void *)local_2e8._0_8_,uVar39);
      }
    }
    iVar26 = 0;
    goto LAB_0027bab6;
  }
  sVar36 = 1;
  if ((*(uint *)(&this->field_0xd0 + (long)p_Var22) & 3) == 0) {
    sVar36 = (ulong)opt->use_packing_layout * 3 + 1;
  }
  uVar33 = (uint)sVar36;
  uVar39 = (ulong)(uVar33 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var22)) {
    uVar39 = sVar36;
  }
  Mat::create(top_blob,iVar29,iVar37,(int)*(uint *)(&this->field_0xd0 + (long)p_Var22) / (int)uVar33
              ,uVar39,uVar33,opt->blob_allocator);
  auVar18 = stack0xfffffffffffffd48;
  iVar26 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0027bab6;
  uVar27 = (int)uVar27 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  uVar21 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  local_298 = (float *)CONCAT44(local_298._4_4_,uVar21);
  iVar24 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar24 = 1;
    if ((uVar27 & 7) == 0) {
      iVar24 = 8;
    }
    _elempack = (uint)((uVar21 & 3) == 0) * 3 + 1;
  }
  local_2e8._8_8_ = CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_2e8._0_8_ = local_228.data;
  local_2e8._16_8_ = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
  local_2e8._24_4_ = local_228.elempack;
  local_2e8._32_8_ = local_228.allocator;
  local_2e8._44_4_ = local_228.w;
  local_2e8._40_4_ = local_228.dims;
  iStack_2b4 = local_228.d;
  local_2e8._48_4_ = local_228.h;
  uStack_2ac = auVar18._12_4_;
  iStack_2b0 = local_228.c;
  local_2a8 = local_228.cstep;
  if ((Allocator *)local_2e8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)&((Allocator *)local_2e8._8_8_)->_vptr_Allocator =
         *(int *)&((Allocator *)local_2e8._8_8_)->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (iVar24 < iVar28) {
    local_288.data = *(void **)opt;
    local_288.elemsize = (size_t)opt->workspace_allocator;
    local_288.elempack = opt->openmp_blocktime;
    local_288._28_1_ = opt->use_winograd_convolution;
    local_288._29_1_ = opt->use_sgemm_convolution;
    local_288._30_1_ = opt->use_int8_inference;
    local_288._31_1_ = opt->use_vulkan_compute;
    local_288.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_288._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_288._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_288._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    local_288.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_228,(Mat *)local_2e8,iVar24,(Option *)&local_288);
  }
  local_288.data = top_blob->data;
  local_288.refcount = top_blob->refcount;
  local_288.elemsize = top_blob->elemsize;
  local_288.elempack = top_blob->elempack;
  local_288.allocator = top_blob->allocator;
  local_288.dims = top_blob->dims;
  local_288.w = top_blob->w;
  local_288.h = top_blob->h;
  local_288.d = top_blob->d;
  local_288.c = top_blob->c;
  local_288.cstep = top_blob->cstep;
  if (local_288.refcount != (int *)0x0) {
    LOCK();
    *local_288.refcount = *local_288.refcount + 1;
    UNLOCK();
  }
  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
  if (_elempack < uVar33) {
    Mat::create(&local_288,iVar29,iVar37,
                *(int *)(&this->field_0xd0 + (long)pp_Var23[-3]) / (int)_elempack,
                (ulong)((byte)(((ushort)uVar39 & 0xff) / (ushort)(byte)sVar36) * _elempack),
                _elempack,opt->workspace_allocator);
    iVar26 = -100;
    if ((local_288.data != (void *)0x0) && ((long)local_288.c * local_288.cstep != 0)) {
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
      goto LAB_0027ad72;
    }
  }
  else {
LAB_0027ad72:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
      iVar40 = (int)local_298 / (int)_elempack;
      iVar37 = 0;
      iVar29 = 0;
      lVar35 = 0;
      do {
        if (local_2e8._40_4_ == 3) {
          local_1a0 = 3;
          lVar42 = (long)(int)local_2e8._48_4_ * (long)(int)local_2e8._44_4_ * local_2e8._16_8_;
          local_194 = 1;
        }
        else {
          local_1a0 = 4;
          lVar42 = (long)(int)local_2e8._48_4_ * (long)(int)local_2e8._44_4_ *
                   (long)iStack_2b4 * local_2e8._16_8_;
          local_194 = iStack_2b4;
        }
        local_1c8 = (pointer)((long)(iVar37 / iVar24) * local_2a8 * local_2e8._16_8_ +
                             local_2e8._0_8_);
        local_19c = local_2e8._44_4_;
        local_1a8 = (Allocator *)local_2e8._32_8_;
        local_1b0 = local_2e8._24_4_;
        local_1c0 = (int *)0x0;
        local_1b8 = (Allocator *)local_2e8._16_8_;
        local_188 = (lVar42 + 0xfU & 0xfffffffffffffff0) / (ulong)local_2e8._16_8_;
        local_198 = local_2e8._48_4_;
        if (local_288.dims == 3) {
          local_158 = 3;
          lVar42 = (long)local_288.h * (long)local_288.w * local_288.elemsize;
          local_14c = 1;
        }
        else {
          local_158 = 4;
          lVar42 = (long)local_288.h * (long)local_288.w * (long)local_288.d * local_288.elemsize;
          local_14c = local_288.d;
        }
        local_180 = (void *)((long)(iVar29 / (int)_elempack) * local_288.cstep * local_288.elemsize
                            + (long)local_288.data);
        local_154 = local_288.w;
        local_160 = local_288.allocator;
        local_168 = local_288.elempack;
        local_178 = (int *)0x0;
        local_170 = local_288.elemsize;
        local_140 = (lVar42 + 0xfU & 0xfffffffffffffff0) / local_288.elemsize;
        local_150 = local_288.h;
        pLVar10 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar35];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        local_68 = *(undefined4 *)&opt->workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        iStack_60 = opt->openmp_blocktime;
        uStack_5c._0_1_ = opt->use_winograd_convolution;
        uStack_5c._1_1_ = opt->use_sgemm_convolution;
        uStack_5c._2_1_ = opt->use_int8_inference;
        uStack_5c._3_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        uStack_54._0_1_ = opt->use_int8_packed;
        uStack_54._1_1_ = opt->use_int8_storage;
        uStack_54._2_1_ = opt->use_int8_arithmetic;
        uStack_54._3_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_4c._0_1_ = opt->use_subgroup_shuffle;
        uStack_4c._1_1_ = opt->use_image_storage;
        uStack_4c._2_1_ = opt->use_tensor_storage;
        uStack_4c._3_1_ = opt->use_weight_fp16_storage;
        local_48._0_4_ = opt->flush_denormals;
        local_48._4_1_ = opt->use_local_pool_allocator;
        local_48._5_1_ = opt->use_reserved_1;
        local_48._6_1_ = opt->use_reserved_2;
        local_48._7_1_ = opt->use_reserved_3;
        uStack_40._0_1_ = opt->use_reserved_4;
        uStack_40._1_1_ = opt->use_reserved_5;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = top_blob->allocator;
        local_190 = (int)uVar27 / iVar24;
        local_148 = iVar40;
        (*pLVar10->_vptr_Layer[7])(pLVar10,&local_1c8,&local_180,&local_78);
        if (local_178 != (int *)0x0) {
          LOCK();
          *local_178 = *local_178 + -1;
          UNLOCK();
          if (*local_178 == 0) {
            if (local_160 == (Allocator *)0x0) {
              if (local_180 != (void *)0x0) {
                free(local_180);
              }
            }
            else {
              (*local_160->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1c0 != (int *)0x0) {
          LOCK();
          *local_1c0 = *local_1c0 + -1;
          UNLOCK();
          if (*local_1c0 == 0) {
            if (local_1a8 == (Allocator *)0x0) {
              if (local_1c8 != (pointer)0x0) {
                free(local_1c8);
              }
            }
            else {
              (*local_1a8->_vptr_Allocator[3])();
            }
          }
        }
        lVar35 = lVar35 + 1;
        iVar29 = iVar29 + (int)local_298;
        iVar37 = iVar37 + uVar27;
      } while (lVar35 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                ));
    }
    if (_elempack < uVar33) {
      convert_packing(&local_288,top_blob,uVar33,opt);
      iVar26 = 0;
    }
    else {
      iVar26 = 0;
      if (&local_288 != top_blob) {
        if (local_288.refcount != (int *)0x0) {
          LOCK();
          *local_288.refcount = *local_288.refcount + 1;
          UNLOCK();
        }
        piVar9 = top_blob->refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar26 = 0;
        top_blob->data = local_288.data;
        top_blob->refcount = local_288.refcount;
        top_blob->elemsize = local_288.elemsize;
        top_blob->elempack = local_288.elempack;
        top_blob->allocator = local_288.allocator;
        top_blob->dims = local_288.dims;
        top_blob->w = local_288.w;
        top_blob->h = local_288.h;
        top_blob->d = local_288.d;
        top_blob->c = local_288.c;
        top_blob->cstep = local_288.cstep;
      }
    }
  }
  if (local_288.refcount != (int *)0x0) {
    LOCK();
    *local_288.refcount = *local_288.refcount + -1;
    UNLOCK();
    if (*local_288.refcount == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_2e8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2e8._8_8_ = *(int *)(_func_int ***)local_2e8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2e8._8_8_ == 0) {
      if ((Allocator *)local_2e8._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          free((void *)local_2e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2e8._32_8_)[3])();
      }
    }
  }
LAB_0027bab6:
  piVar9 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if ((pointer)local_228.data != (pointer)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    *local_130.refcount = *local_130.refcount + -1;
    UNLOCK();
    if (*local_130.refcount == 0) {
      if (local_130.allocator == (Allocator *)0x0) {
        if (local_130.data != (void *)0x0) {
          free(local_130.data);
        }
      }
      else {
        (*(local_130.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}